

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O2

void __thiscall Fl_Function_Type::write_code2(Fl_Function_Type *this)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  Fl_Function_Type *pFVar5;
  
  bVar2 = true;
  pcVar4 = "w";
  pFVar5 = this;
  while ((pFVar5 = (Fl_Function_Type *)(pFVar5->super_Fl_Type).next,
         pFVar5 != (Fl_Function_Type *)0x0 &&
         ((this->super_Fl_Type).level < (pFVar5->super_Fl_Type).level))) {
    iVar3 = (*(pFVar5->super_Fl_Type)._vptr_Fl_Type[0x21])(pFVar5);
    bVar2 = false;
    if (iVar3 != 0) {
      pcVar1 = (pFVar5->super_Fl_Type).name_;
      if (pcVar1 != (char *)0x0) {
        pcVar4 = pcVar1;
      }
      bVar2 = false;
    }
  }
  if ((this->super_Fl_Type).name_ == (char *)0x0) {
    if (this->havewidgets != '\0') {
      write_c("  %s->show(argc, argv);\n",pcVar4);
    }
    if (bVar2) {
      indentation = 0;
      return;
    }
    write_c("  return Fl::run();\n");
  }
  else {
    if (((this->havewidgets != '\0') && (this->constructor == '\0')) &&
       (this->return_type == (char *)0x0)) {
      write_c("  return %s;\n",pcVar4);
    }
    if (bVar2) {
      indentation = 0;
      return;
    }
  }
  write_c("}\n");
  indentation = 0;
  return;
}

Assistant:

void Fl_Function_Type::write_code2() {
  Fl_Type *child;
  const char *var = "w";
  char havechildren = 0;
  for (child = next; child && child->level > level; child = child->next) {
    havechildren = 1;
    if (child->is_window() && child->name()) var = child->name();
  }
  
  if (ismain()) {
    if (havewidgets) write_c("  %s->show(argc, argv);\n", var);
    if (havechildren) write_c("  return Fl::run();\n");
  } else if (havewidgets && !constructor && !return_type) {
    write_c("  return %s;\n", var);
  }
  if (havechildren)
    write_c("}\n");
  indentation = 0;
}